

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::SpellGroup(Map *this,Character *from,unsigned_short spell_id)

{
  _Rb_tree_header *p_Var1;
  unsigned_short uVar2;
  short sVar3;
  Character *this_00;
  World *pWVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ESF_Data *pEVar8;
  mapped_type *pmVar9;
  _Base_ptr p_Var10;
  undefined6 in_register_00000012;
  unsigned_short num;
  ushort uVar11;
  _List_node_base *p_Var12;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  int iVar13;
  pointer ppCVar14;
  pointer ppCVar15;
  Character *character;
  PacketBuilder builder;
  set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> in_range;
  key_type local_100;
  key_type local_e0;
  pointer local_c0;
  ESF_Data *local_b8;
  key_type local_b0;
  PacketBuilder local_90;
  _Rb_tree<Character_*,_Character_*,_std::_Identity<Character_*>,_std::less<Character_*>,_std::allocator<Character_*>_>
  local_60;
  
  pEVar8 = ESF::Get(from->world->esf,(uint)CONCAT62(in_register_00000012,spell_id));
  if (pEVar8->id == 0) {
    return;
  }
  if (pEVar8->type != Heal) {
    return;
  }
  if (from->party == (Party *)0x0) {
    return;
  }
  if (from->tp < pEVar8->tp) {
    return;
  }
  from->tp = from->tp - pEVar8->tp;
  uVar2 = pEVar8->hp;
  if ((from->nointeract & 4U) != 0) {
    if ((from->nointeract & 0x20U) != 0) {
      bVar6 = true;
      bVar5 = false;
      goto LAB_0015b41d;
    }
    if (from->map->pk == false) {
      pWVar4 = this->world;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"GlobalPK","");
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&pWVar4->config,&local_b0);
      bVar6 = util::variant::GetBool(pmVar9);
      bVar5 = true;
      if (bVar6) {
        bVar6 = World::PKExcept(this->world,(int)this->id);
      }
      else {
        bVar6 = true;
      }
      goto LAB_0015b41d;
    }
  }
  bVar5 = false;
  bVar6 = false;
LAB_0015b41d:
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  num = 1;
  if ((short)uVar2 < 1) {
    num = uVar2;
  }
  if (bVar6 == false) {
    num = uVar2;
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  PacketBuilder::PacketBuilder
            (&local_90,PACKET_SPELL,PACKET_TARGET_GROUP,
             ((long)(from->party->members).
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(from->party->members).
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 10 + 8);
  local_b8 = pEVar8;
  PacketBuilder::AddShort(&local_90,spell_id);
  PacketBuilder::AddShort(&local_90,(unsigned_short)from->player->id);
  PacketBuilder::AddShort(&local_90,from->tp);
  PacketBuilder::AddShort(&local_90,num);
  ppCVar15 = (from->party->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppCVar14 = (from->party->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar15 != ppCVar14) {
    local_c0 = ppCVar14;
    do {
      this_00 = *ppCVar15;
      if (this_00->map == from->map) {
        iVar13 = (int)local_b8->hp;
        pWVar4 = this->world;
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"LimitDamage","");
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar4->config,&local_100);
        bVar5 = util::variant::GetBool(pmVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if ((bVar5) && (iVar7 = (int)this_00->maxhp - (int)this_00->hp, iVar7 < iVar13)) {
          iVar13 = iVar7;
        }
        bVar5 = false;
        uVar11 = 0;
        if (0 < iVar13) {
          uVar11 = (ushort)iVar13;
        }
        bVar6 = false;
        if ((from->nointeract & 4U) != 0) {
          if ((from->nointeract & 0x20U) == 0) {
            if (from->map->pk == false) {
              pWVar4 = this->world;
              local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"GlobalPK","");
              pmVar9 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&pWVar4->config,&local_e0);
              bVar6 = util::variant::GetBool(pmVar9);
              bVar5 = true;
              if (bVar6) {
                bVar6 = World::PKExcept(this->world,(int)this->id);
                bVar5 = true;
              }
              else {
                bVar6 = true;
              }
            }
            else {
              bVar5 = false;
              bVar6 = false;
            }
          }
          else {
            bVar6 = true;
            bVar5 = false;
          }
        }
        if ((bVar5) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2)) {
          operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
        }
        if (bVar6 != false) {
          uVar11 = (ushort)(0 < iVar13);
        }
        this_00->hp = this_00->hp + uVar11;
        pWVar4 = this->world;
        local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"LimitDamage","");
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar4->config,&local_100);
        ppCVar14 = local_c0;
        bVar5 = util::variant::GetBool(pmVar9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if (!bVar5) {
          sVar3 = this_00->hp;
          if (this_00->maxhp < this_00->hp) {
            sVar3 = this_00->maxhp;
          }
          this_00->hp = sVar3;
        }
        PacketBuilder::AddByte(&local_90,0xff);
        PacketBuilder::AddByte(&local_90,0xff);
        PacketBuilder::AddByte(&local_90,0xff);
        PacketBuilder::AddByte(&local_90,0xff);
        PacketBuilder::AddByte(&local_90,0xff);
        PacketBuilder::AddShort(&local_90,(unsigned_short)this_00->player->id);
        iVar13 = (int)(((double)(int)this_00->hp / (double)(int)this_00->maxhp) * 100.0);
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        if (99 < iVar13) {
          iVar13 = 100;
        }
        PacketBuilder::AddChar(&local_90,(uchar)iVar13);
        PacketBuilder::AddShort(&local_90,this_00->hp);
        for (p_Var12 = (this->characters).
                       super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
                       super__List_node_base._M_next;
            p_Var12 != (_List_node_base *)&this->characters; p_Var12 = p_Var12->_M_next) {
          local_100._M_dataplus._M_p = (pointer)p_Var12[1]._M_next;
          if (((this_00->nowhere == false) &&
              (*(char *)((long)&((_List_node_base *)local_100._M_dataplus._M_p)->_M_prev + 5) ==
               '\0')) &&
             (bVar5 = Character::InRange(this_00,*(uchar *)&((_List_node_base *)
                                                            ((long)local_100._M_dataplus._M_p + 0xc0
                                                            ))->_M_next,
                                         *(uchar *)((long)local_100._M_dataplus._M_p + 0xc0U + 1)),
             bVar5)) {
            std::
            _Rb_tree<Character*,Character*,std::_Identity<Character*>,std::less<Character*>,std::allocator<Character*>>
            ::_M_insert_unique<Character*const&>
                      ((_Rb_tree<Character*,Character*,std::_Identity<Character*>,std::less<Character*>,std::allocator<Character*>>
                        *)&local_60,(Character **)&local_100);
          }
        }
      }
      ppCVar15 = ppCVar15 + 1;
    } while (ppCVar15 != ppCVar14);
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      EOClient::Send(*(EOClient **)(*(long *)(*(long *)(p_Var10 + 1) + 0x3e0) + 0x78),&local_90);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != p_Var1);
  }
  PacketBuilder::~PacketBuilder(&local_90);
  std::
  _Rb_tree<Character_*,_Character_*,_std::_Identity<Character_*>,_std::less<Character_*>,_std::allocator<Character_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void Map::SpellGroup(Character *from, unsigned short spell_id)
{
	const ESF_Data &spell = from->world->esf->Get(spell_id);

	if (!spell || spell.type != ESF::Heal || !from->party || from->tp < spell.tp)
		return;

	from->tp -= spell.tp;

	int displayhp = spell.hp;

	if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
	{
		displayhp = std::min(displayhp, 1);
	}

	std::set<Character *> in_range;

	PacketBuilder builder(PACKET_SPELL, PACKET_TARGET_GROUP, 8 + from->party->members.size() * 10);
	builder.AddShort(spell_id);
	builder.AddShort(from->PlayerID());
	builder.AddShort(from->tp);
	builder.AddShort(displayhp);

	UTIL_FOREACH(from->party->members, member)
	{
		if (member->map != from->map)
			continue;

		int displayhp = spell.hp;
		int hpgain = spell.hp;

		if (this->world->config["LimitDamage"])
			hpgain = std::min(hpgain, member->maxhp - member->hp);

		hpgain = std::max(hpgain, 0);

		if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
			hpgain = std::min(hpgain, 1);

		member->hp += hpgain;

		if (!this->world->config["LimitDamage"])
			member->hp = std::min(member->hp, member->maxhp);

		// wat?
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);

		builder.AddShort(member->PlayerID());
		builder.AddChar(util::clamp<int>(double(member->hp) / double(member->maxhp) * 100.0, 0, 100));
		builder.AddShort(member->hp);

		UTIL_FOREACH(this->characters, character)
		{
			if (member->InRange(character))
				in_range.insert(character);
		}
	}

	UTIL_FOREACH(in_range, character)
	{
		character->Send(builder);
	}
}